

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_tracker.cpp
# Opt level: O0

void __thiscall libtorrent::dht::dht_tracker::refresh_timeout(dht_tracker *this,error_code *e)

{
  bool bVar1;
  int iVar2;
  undefined1 local_90 [68];
  int local_4c;
  duration<long,_std::ratio<1L,_1L>_> local_48;
  duration local_40;
  reference local_38;
  pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node> *n;
  iterator __end2;
  iterator __begin2;
  tracker_nodes_t *__range2;
  error_code *e_local;
  dht_tracker *this_local;
  
  bVar1 = boost::system::error_code::operator_cast_to_bool(e);
  if ((!bVar1) && ((this->m_running & 1U) != 0)) {
    __end2 = ::std::
             map<libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node,_std::less<libtorrent::aux::listen_socket_handle>,_std::allocator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>_>
             ::begin(&this->m_nodes);
    n = (pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>
         *)::std::
           map<libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node,_std::less<libtorrent::aux::listen_socket_handle>,_std::allocator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>_>
           ::end(&this->m_nodes);
    while (bVar1 = ::std::operator!=(&__end2,(_Self *)&n), bVar1) {
      local_38 = ::std::
                 _Rb_tree_iterator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>
                 ::operator*(&__end2);
      dht::node::tick(&(local_38->second).dht);
      ::std::
      _Rb_tree_iterator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>
      ::operator++(&__end2);
    }
    iVar2 = libtorrent::aux::session_settings::get_int(this->m_settings,0x4090);
    dos_blocker::set_block_timer(&this->m_blocker,iVar2);
    iVar2 = libtorrent::aux::session_settings::get_int(this->m_settings,0x4091);
    dos_blocker::set_rate_limit(&this->m_blocker,iVar2);
    local_4c = 5;
    ::std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1l>> *)&local_48,&local_4c);
    ::std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1l>,void>
              ((duration<long,std::ratio<1l,1000000000l>> *)&local_40,&local_48);
    boost::asio::
    basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
    ::expires_after(&this->m_refresh_timer,&local_40);
    local_90._16_8_ = refresh_timeout;
    local_90._24_8_ = (pointer)0x0;
    self((dht_tracker *)local_90);
    ::std::
    bind<void(libtorrent::dht::dht_tracker::*)(boost::system::error_code_const&),std::shared_ptr<libtorrent::dht::dht_tracker>,std::_Placeholder<1>const&>
              ((type *)(local_90 + 0x20),(offset_in_dht_tracker_to_subr *)(local_90 + 0x10),
               (shared_ptr<libtorrent::dht::dht_tracker> *)local_90,
               (_Placeholder<1> *)&::std::placeholders::_1);
    boost::asio::
    basic_waitable_timer<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
    ::
    async_wait<std::_Bind<void(libtorrent::dht::dht_tracker::*(std::shared_ptr<libtorrent::dht::dht_tracker>,std::_Placeholder<1>))(boost::system::error_code_const&)>>
              ((basic_waitable_timer<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
                *)&this->m_refresh_timer,
               (_Bind<void_(libtorrent::dht::dht_tracker::*(std::shared_ptr<libtorrent::dht::dht_tracker>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
                *)(local_90 + 0x20));
    ::std::
    _Bind<void_(libtorrent::dht::dht_tracker::*(std::shared_ptr<libtorrent::dht::dht_tracker>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
    ::~_Bind((_Bind<void_(libtorrent::dht::dht_tracker::*(std::shared_ptr<libtorrent::dht::dht_tracker>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
              *)(local_90 + 0x20));
    ::std::shared_ptr<libtorrent::dht::dht_tracker>::~shared_ptr
              ((shared_ptr<libtorrent::dht::dht_tracker> *)local_90);
  }
  return;
}

Assistant:

void dht_tracker::refresh_timeout(error_code const& e)
	{
		COMPLETE_ASYNC("dht_tracker::refresh_timeout");
		if (e || !m_running) return;

		for (auto& n : m_nodes)
			n.second.dht.tick();

		// periodically update the DOS blocker's settings from the dht_settings
		m_blocker.set_block_timer(m_settings.get_int(settings_pack::dht_block_timeout));
		m_blocker.set_rate_limit(m_settings.get_int(settings_pack::dht_block_ratelimit));

		m_refresh_timer.expires_after(seconds(5));
		ADD_OUTSTANDING_ASYNC("dht_tracker::refresh_timeout");
		m_refresh_timer.async_wait(
			std::bind(&dht_tracker::refresh_timeout, self(), _1));
	}